

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test::
~TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test
          (TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test
           *this)

{
  TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test
  *this_local;
  
  ~TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test
            (this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectWithFunctionComparatorThatFailsCoversValueToString)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting object(5);
    MockFunctionComparator comparator(myTypeIsEqual, myTypeValueToString);
    mock().installComparator("MyTypeForTesting", comparator);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("function")->withParameterOfType("MyTypeForTesting", "parameterName", &object);
    MockExpectedCallsDidntHappenFailure failure(UtestShell::getCurrent(), expectations);

    mock().expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE_LOCATION(failure, __FILE__, __LINE__);
}